

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NTSCD.cpp
# Opt level: O3

void __thiscall
dg::llvmdg::legacy::NTSCD::computeInterprocDependencies(NTSCD *this,Function *function)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  NTSCD *this_00;
  size_t sVar3;
  bool bVar4;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *psVar5;
  _Rb_tree_node_base *p_Var6;
  Block *b;
  _Link_type p_Var7;
  Block *b_00;
  _Rb_tree_node_base *p_Var8;
  Block *pBVar9;
  Block *a;
  Block *this_01;
  Block *node;
  queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
  q;
  Block *successor;
  unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  visited;
  allocator_type local_151;
  _Rb_tree_node_base *local_150;
  Block *local_148;
  _Hashtable<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_140;
  undefined1 local_138 [16];
  _Link_type local_128;
  _Link_type p_Stack_120;
  _Base_ptr local_118;
  size_t sStack_110;
  _Link_type local_108;
  undefined8 uStack_100;
  long local_f8;
  undefined8 uStack_f0;
  NTSCD *local_e0;
  _Hash_node_base *local_d8;
  Function *local_d0;
  _Hashtable<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_c8;
  _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  local_90;
  _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  local_60;
  
  local_e0 = this;
  local_d0 = function;
  Function::nodes((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                   *)&local_90,function);
  if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_90._M_impl.super__Rb_tree_header) {
    p_Var8 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      this_01 = *(Block **)(p_Var8 + 1);
      Block::callees((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                      *)local_138,this_01);
      if (sStack_110 == 0) {
        Block::joins((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                      *)&local_c8,this_01);
        sVar3 = local_c8._M_rehash_policy._M_next_resize;
        std::
        _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
        ::_M_erase((_Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                    *)&local_c8,(_Link_type)local_c8._M_before_begin._M_nxt);
        std::
        _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
        ::_M_erase((_Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                    *)local_138,local_128);
        if (sVar3 != 0) goto LAB_00129884;
      }
      else {
        std::
        _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
        ::_M_erase((_Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                    *)local_138,local_128);
LAB_00129884:
        psVar5 = Block::successors(this_01);
        p_Var6 = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        psVar5 = Block::successors(this_01);
        while (((_Rb_tree_header *)p_Var6 != &(psVar5->_M_t)._M_impl.super__Rb_tree_header &&
               (bVar4 = Block::isCallReturn(*(Block **)(p_Var6 + 1)), !bVar4))) {
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        }
        psVar5 = Block::successors(this_01);
        if ((_Rb_tree_header *)p_Var6 != &(psVar5->_M_t)._M_impl.super__Rb_tree_header) {
          pBVar9 = this_01;
          local_150 = p_Var8;
          Block::callees((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                          *)local_138,this_01);
          this_00 = local_e0;
          p_Var7 = p_Stack_120;
          while (p_Var7 != (_Link_type)(local_138 + 8)) {
            a = *(Block **)(p_Var6 + 1);
            Function::exit(*(Function **)((p_Var7->_M_storage)._M_storage + 8),(int)pBVar9);
            addControlDependence(this_00,a,b);
            p_Var7 = (_Link_type)std::_Rb_tree_increment(&p_Var7->super__Rb_tree_node_base);
            pBVar9 = a;
          }
          std::
          _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
          ::_M_erase((_Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                      *)local_138,local_128);
          Block::joins((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                        *)local_138,this_01);
          p_Var7 = p_Stack_120;
          while (p_Var7 != (_Link_type)(local_138 + 8)) {
            pBVar9 = *(Block **)(p_Var6 + 1);
            Function::exit(*(Function **)((p_Var7->_M_storage)._M_storage + 8),(int)this_01);
            addControlDependence(this_00,pBVar9,b_00);
            p_Var7 = (_Link_type)std::_Rb_tree_increment(&p_Var7->super__Rb_tree_node_base);
            this_01 = pBVar9;
          }
          std::
          _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
          ::_M_erase((_Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                      *)local_138,local_128);
          p_Var8 = local_150;
        }
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != &local_90._M_impl.super__Rb_tree_header);
  }
  Function::callReturnNodes
            ((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
              *)&local_60,local_d0);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    do {
      local_148 = *(Block **)(local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1);
      local_f8 = 0;
      uStack_f0 = 0;
      local_108 = (_Link_type)0x0;
      uStack_100 = 0;
      local_118 = (_Base_ptr)0x0;
      sStack_110 = 0;
      local_128 = (_Link_type)0x0;
      p_Stack_120 = (_Link_type)0x0;
      local_138._0_8_ = 0;
      local_138._8_8_ = 0;
      local_150 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      std::_Deque_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>::
      _M_initialize_map((_Deque_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                         *)local_138,0);
      std::
      _Hashtable<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_Hashtable(&local_c8,local_90._M_impl.super__Rb_tree_header._M_node_count,
                   (hash<dg::llvmdg::legacy::Block_*> *)&local_140,(key_equal *)&local_d8,&local_151
                  );
      local_140 = &local_c8;
      std::
      _Hashtable<dg::llvmdg::legacy::Block*,dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>,std::__detail::_Identity,std::equal_to<dg::llvmdg::legacy::Block*>,std::hash<dg::llvmdg::legacy::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<dg::llvmdg::legacy::Block*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<dg::llvmdg::legacy::Block*,false>>>>
                ((_Hashtable<dg::llvmdg::legacy::Block*,dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>,std::__detail::_Identity,std::equal_to<dg::llvmdg::legacy::Block*>,std::hash<dg::llvmdg::legacy::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_c8,&local_148,(hash<dg::llvmdg::legacy::Block_*> *)&local_140);
      psVar5 = Block::successors(local_148);
      for (p_Var8 = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &(psVar5->_M_t)._M_impl.super__Rb_tree_header;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        local_d8 = *(_Hash_node_base **)(p_Var8 + 1);
        if (local_c8._M_buckets[(ulong)local_d8 % local_c8._M_bucket_count] != (__node_base_ptr)0x0)
        {
          p_Var1 = local_c8._M_buckets[(ulong)local_d8 % local_c8._M_bucket_count]->_M_nxt;
          p_Var2 = p_Var1[1]._M_nxt;
          do {
            if (local_d8 == p_Var2) goto LAB_00129b03;
            p_Var1 = p_Var1->_M_nxt;
          } while ((p_Var1 != (_Hash_node_base *)0x0) &&
                  (p_Var2 = p_Var1[1]._M_nxt,
                  (ulong)p_Var2 % local_c8._M_bucket_count ==
                  (ulong)local_d8 % local_c8._M_bucket_count));
        }
        if (local_108 == (_Link_type)(local_f8 + -8)) {
          std::deque<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>::
          _M_push_back_aux<dg::llvmdg::legacy::Block*const&>
                    ((deque<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>> *
                     )local_138,(Block **)&local_d8);
        }
        else {
          *(_Hash_node_base **)&local_108->super__Rb_tree_node_base = local_d8;
          local_108 = (_Link_type)&(local_108->super__Rb_tree_node_base)._M_parent;
        }
        local_140 = &local_c8;
        std::
        _Hashtable<dg::llvmdg::legacy::Block*,dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>,std::__detail::_Identity,std::equal_to<dg::llvmdg::legacy::Block*>,std::hash<dg::llvmdg::legacy::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<dg::llvmdg::legacy::Block*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<dg::llvmdg::legacy::Block*,false>>>>
                  ((_Hashtable<dg::llvmdg::legacy::Block*,dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>,std::__detail::_Identity,std::equal_to<dg::llvmdg::legacy::Block*>,std::hash<dg::llvmdg::legacy::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_c8,(key_equal *)&local_d8,
                   (hash<dg::llvmdg::legacy::Block_*> *)&local_140);
LAB_00129b03:
      }
      while (local_108 != local_128) {
        addControlDependence(local_e0,*(Block **)&local_128->super__Rb_tree_node_base,local_148);
        psVar5 = Block::successors(*(Block **)&local_128->super__Rb_tree_node_base);
        for (p_Var8 = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var8 != &(psVar5->_M_t)._M_impl.super__Rb_tree_header;
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          local_d8 = *(_Hash_node_base **)(p_Var8 + 1);
          if (local_c8._M_buckets[(ulong)local_d8 % local_c8._M_bucket_count] !=
              (__node_base_ptr)0x0) {
            p_Var1 = local_c8._M_buckets[(ulong)local_d8 % local_c8._M_bucket_count]->_M_nxt;
            p_Var2 = p_Var1[1]._M_nxt;
            do {
              if (local_d8 == p_Var2) goto LAB_00129bef;
              p_Var1 = p_Var1->_M_nxt;
            } while ((p_Var1 != (_Hash_node_base *)0x0) &&
                    (p_Var2 = p_Var1[1]._M_nxt,
                    (ulong)p_Var2 % local_c8._M_bucket_count ==
                    (ulong)local_d8 % local_c8._M_bucket_count));
          }
          if (local_108 == (_Link_type)(local_f8 + -8)) {
            std::deque<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>::
            _M_push_back_aux<dg::llvmdg::legacy::Block*const&>
                      ((deque<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>
                        *)local_138,(Block **)&local_d8);
          }
          else {
            *(_Hash_node_base **)&local_108->super__Rb_tree_node_base = local_d8;
            local_108 = (_Link_type)&(local_108->super__Rb_tree_node_base)._M_parent;
          }
          local_140 = &local_c8;
          std::
          _Hashtable<dg::llvmdg::legacy::Block*,dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>,std::__detail::_Identity,std::equal_to<dg::llvmdg::legacy::Block*>,std::hash<dg::llvmdg::legacy::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<dg::llvmdg::legacy::Block*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<dg::llvmdg::legacy::Block*,false>>>>
                    ((_Hashtable<dg::llvmdg::legacy::Block*,dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>,std::__detail::_Identity,std::equal_to<dg::llvmdg::legacy::Block*>,std::hash<dg::llvmdg::legacy::Block*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_c8,(key_equal *)&local_d8,
                     (hash<dg::llvmdg::legacy::Block_*> *)&local_140);
LAB_00129bef:
        }
        if (local_128 ==
            (_Link_type)
            &(((_Rb_tree_node<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                *)(local_118 + -1))->super__Rb_tree_node_base)._M_right) {
          operator_delete(p_Stack_120,0x200);
          local_128 = *(_Link_type *)(sStack_110 + 8);
          local_118 = (_Base_ptr)&local_128[10]._M_storage;
          p_Stack_120 = local_128;
          sStack_110 = sStack_110 + 8;
        }
        else {
          local_128 = (_Link_type)&(local_128->super__Rb_tree_node_base)._M_parent;
        }
      }
      std::
      _Hashtable<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>,_std::__detail::_Identity,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_c8);
      std::_Deque_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>::
      ~_Deque_base((_Deque_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                    *)local_138);
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)std::_Rb_tree_increment(local_150);
    } while ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
             &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  ::_M_erase(&local_90,(_Link_type)local_90._M_impl.super__Rb_tree_header._M_header._M_parent);
  return;
}

Assistant:

void NTSCD::computeInterprocDependencies(Function *function) {
    DBG_SECTION_BEGIN(cda, "Computing interprocedural CD");

    const auto &nodes = function->nodes();
    for (auto *node : nodes) {
        if (!node->callees().empty() || !node->joins().empty()) {
            auto iterator = std::find_if(
                    node->successors().begin(), node->successors().end(),
                    [](const Block *block) { return block->isCallReturn(); });
            if (iterator != node->successors().end()) {
                for (auto callee : node->callees()) {
                    addControlDependence(*iterator, callee.second->exit());
                }
                for (auto join : node->joins()) {
                    addControlDependence(*iterator, join.second->exit());
                }
            }
        }
    }

    for (auto *node : function->callReturnNodes()) {
        std::queue<Block *> q;
        std::unordered_set<Block *> visited(nodes.size());
        visited.insert(node);
        for (auto *successor : node->successors()) {
            if (visited.find(successor) == visited.end()) {
                q.push(successor);
                visited.insert(successor);
            }
        }
        while (!q.empty()) {
            addControlDependence(q.front(), node);
            for (auto *successor : q.front()->successors()) {
                if (visited.find(successor) == visited.end()) {
                    q.push(successor);
                    visited.insert(successor);
                }
            }
            q.pop();
        }
    }
    DBG_SECTION_END(cda, "Finished computing interprocedural CD");
}